

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateValueIndex
          (HtmlparserCppTest *this,string *expected_value_index)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  int index;
  
  index = (int)((ulong)in_RAX >> 0x20);
  bVar1 = safe_strto32(expected_value_index,&index);
  if (bVar1) {
    iVar2 = HtmlParser::ValueIndex(&this->parser_);
    if (index == iVar2) {
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","index","==","parser_.ValueIndex()");
  }
  else {
    fprintf(_stderr,"Check failed: %s\n","safe_strto32(expected_value_index, &index)");
  }
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateValueIndex(const string &expected_value_index) {
  int index;
  CHECK(safe_strto32(expected_value_index, &index));
  EXPECT_EQ(index, parser_.ValueIndex())
      << "Unexpected value_index value at line " << parser_.line_number();
}